

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
             *this,counting_iterator<char> *it)

{
  unkuint9 Var1;
  undefined8 in_R8;
  counting_iterator<char> cVar2;
  __type _Var3;
  counting_iterator<char> __first;
  
  if (*(long *)(this + 0x10) == 0) {
    Var1 = CONCAT18(it->blackhole_,(char *)it->count_);
  }
  else {
    cVar2.count_ = (ulong)*(uint *)&it->blackhole_;
    cVar2._8_8_ = in_R8;
    cVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v5::internal::counting_iterator<char>>
                      (*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8),
                       (char *)(*(__copy_move<false,false,std::random_access_iterator_tag> **)
                                 (this + 8) + *(long *)(this + 0x10)),(char *)it->count_,cVar2);
    Var1 = cVar2._0_9_;
    it->count_ = cVar2.count_;
    it->blackhole_ = cVar2.blackhole_;
  }
  __first._9_7_ = 0;
  __first.count_ = (long)Var1;
  __first.blackhole_ = (char)(Var1 >> 0x40);
  _Var3 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                    (__first,*(unsigned_long *)(this + 0x20),(char *)(this + 0x18));
  it->count_ = _Var3.count_;
  it->blackhole_ = _Var3.blackhole_;
  int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
            ((hex_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }